

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPUDetailsWidget.cpp
# Opt level: O2

bool __thiscall GPUDetailsWidget::event(GPUDetailsWidget *this,QEvent *event)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<char16_t> local_50;
  QRect local_38;
  
  if (*(short *)(event + 8) != 0x6e) {
    bVar2 = (bool)QWidget::event((QEvent *)this);
    return bVar2;
  }
  lVar1 = QWidget::childAt((QPoint *)this);
  if (lVar1 != 0) {
    QWidget::toolTip();
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (local_50.size != 0) {
      QWidget::toolTip();
      local_38.x1 = 0;
      local_38.y1 = 0;
      local_38.x2 = -1;
      local_38.y2 = -1;
      QToolTip::showText((QPoint *)(event + 0x18),(QString *)&local_50,(QWidget *)0x0,&local_38,-1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      return true;
    }
  }
  QToolTip::hideText();
  event[0xc] = (QEvent)0x0;
  return true;
}

Assistant:

bool GPUDetailsWidget::event(QEvent *event) {
    if (event->type() == QEvent::ToolTip) {
        auto helpEvent = static_cast<QHelpEvent*>(event);

        if (auto child = childAt(helpEvent->pos()); child && !child->toolTip().isEmpty()) {
            QToolTip::showText(helpEvent->globalPos(), child->toolTip());
            return true;
        }

        QToolTip::hideText();
        event->ignore();

        return true;
    }

    return QWidget::event(event);
}